

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O1

void __thiscall Nes_Vrc6_Apu::reset(Nes_Vrc6_Apu *this)

{
  uint8_t *puVar1;
  long lVar2;
  
  this->last_time = 0;
  lVar2 = 0x10;
  do {
    this->oscs[0].regs[lVar2 + -0xe] = '\0';
    puVar1 = this->oscs[0].regs + lVar2 + -0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1 = this->oscs[0].regs + lVar2;
    *(undefined8 *)puVar1 = 0;
    *(Blip_Buffer **)(puVar1 + 8) = (Blip_Buffer *)0x1;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x70);
  return;
}

Assistant:

void Nes_Vrc6_Apu::reset()
{
	last_time = 0;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc& osc = oscs [i];
		for ( int j = 0; j < reg_count; j++ )
			osc.regs [j] = 0;
		osc.delay = 0;
		osc.last_amp = 0;
		osc.phase = 1;
		osc.amp = 0;
	}
}